

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.hpp
# Opt level: O2

bool __thiscall spirv_cross::MSLConstexprSampler::swizzle_has_one_or_zero(MSLConstexprSampler *this)

{
  bool bVar1;
  
  bVar1 = true;
  if (((1 < this->swizzle[0] - MSL_COMPONENT_SWIZZLE_ZERO) &&
      (1 < this->swizzle[1] - MSL_COMPONENT_SWIZZLE_ZERO)) &&
     (1 < this->swizzle[2] - MSL_COMPONENT_SWIZZLE_ZERO)) {
    bVar1 = this->swizzle[3] - MSL_COMPONENT_SWIZZLE_ZERO < 2;
  }
  return bVar1;
}

Assistant:

bool swizzle_has_one_or_zero() const
	{
		return (swizzle[0] == MSL_COMPONENT_SWIZZLE_ZERO || swizzle[0] == MSL_COMPONENT_SWIZZLE_ONE ||
		        swizzle[1] == MSL_COMPONENT_SWIZZLE_ZERO || swizzle[1] == MSL_COMPONENT_SWIZZLE_ONE ||
		        swizzle[2] == MSL_COMPONENT_SWIZZLE_ZERO || swizzle[2] == MSL_COMPONENT_SWIZZLE_ONE ||
		        swizzle[3] == MSL_COMPONENT_SWIZZLE_ZERO || swizzle[3] == MSL_COMPONENT_SWIZZLE_ONE);
	}